

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O0

Token * __thiscall
FloatType::parseNumber
          (Token *__return_storage_ptr__,FloatType *this,string *str,char *current,size_t *index)

{
  undefined8 uVar1;
  initializer_list<NumericConstantChar> __l;
  int iVar2;
  undefined8 uVar3;
  char *pcVar4;
  runtime_error *this_00;
  NumericConstant local_a0;
  NumericConstantChar local_79;
  undefined8 local_78;
  size_t next;
  bool hasDecimalPoint;
  allocator<NumericConstantChar> local_5a;
  NumericConstantChar local_59;
  iterator local_58;
  size_type local_50;
  undefined1 local_48 [8];
  NumericChars chars;
  size_t *index_local;
  char *current_local;
  string *str_local;
  FloatType *this_local;
  
  chars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)index;
  local_59 = NumericConstantChars::getChar(*current);
  local_58 = &local_59;
  local_50 = 1;
  std::allocator<NumericConstantChar>::allocator(&local_5a);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::vector
            ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_48,__l,
             &local_5a);
  std::allocator<NumericConstantChar>::~allocator(&local_5a);
  next._3_1_ = 0;
  while( true ) {
    uVar1 = *(undefined8 *)
             chars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_78 = uVar1 + One;
    uVar3 = std::__cxx11::string::size();
    if ((ulong)uVar3 <= (ulong)(uVar1 + One)) break;
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)str);
    iVar2 = tolower((int)*pcVar4);
    *current = (char)iVar2;
    if (*current == '.') {
      if ((next._3_1_ & 1) != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"The token already contains a decimal point.");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      next._3_1_ = 1;
    }
    else {
      iVar2 = isdigit((int)*current);
      if (iVar2 == 0) break;
    }
    local_79 = NumericConstantChars::getChar(*current);
    std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::push_back
              ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_48,
               &local_79);
    *(undefined8 *)
     chars.super__Vector_base<NumericConstantChar,_std::allocator<NumericConstantChar>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage = local_78;
  }
  NumericConstant::NumericConstant
            (&local_a0,(vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_48
            );
  Token::Token(__return_storage_ptr__,&local_a0);
  NumericConstant::~NumericConstant(&local_a0);
  std::vector<NumericConstantChar,_std::allocator<NumericConstantChar>_>::~vector
            ((vector<NumericConstantChar,_std::allocator<NumericConstantChar>_> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Token FloatType::parseNumber(std::string& str, char& current, std::size_t& index) const {
	NumericChars chars({ NumericConstantChars::getChar(current) });
	bool hasDecimalPoint = false;

	while (true) {
		std::size_t next = index + 1;

		if (next >= str.size()) {
			break;
		}

		current = (char)std::tolower(str[next]);

		if (current == '.') {
			if (!hasDecimalPoint) {
				hasDecimalPoint = true;
			} else {
				throw std::runtime_error("The token already contains a decimal point.");
			}
		} else {
			if (!isdigit(current)) {
				break;
			}
		}

		chars.push_back(NumericConstantChars::getChar(current));
		index = next;
	}

	return NumericConstant(chars);
}